

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadBytes
          (BinaryReader *this,void **out_data,Address *out_data_size,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  Result RVar3;
  ulong uVar4;
  Enum EVar5;
  uint32_t data_size;
  
  data_size = 0;
  RVar3 = ReadU32Leb128(this,&data_size,"data size");
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    OVar2 = (this->state_).offset;
    uVar4 = (ulong)data_size;
    if (this->read_end_ < OVar2 + uVar4) {
      PrintError(this,"unable to read data: %s",desc);
    }
    else {
      *out_data = (this->state_).data + OVar2;
      *out_data_size = uVar4;
      pOVar1 = &(this->state_).offset;
      *pOVar1 = *pOVar1 + uVar4;
      EVar5 = Ok;
    }
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReader::ReadBytes(const void** out_data,
                               Address* out_data_size,
                               const char* desc) {
  uint32_t data_size = 0;
  CHECK_RESULT(ReadU32Leb128(&data_size, "data size"));

  ERROR_UNLESS(state_.offset + data_size <= read_end_,
               "unable to read data: %s", desc);

  *out_data = static_cast<const uint8_t*>(state_.data) + state_.offset;
  *out_data_size = data_size;
  state_.offset += data_size;
  return Result::Ok;
}